

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodeRemoveWindow(ImGuiDockNode *node,ImGuiWindow *window,ImGuiID save_dock_id)

{
  ImVector<ImGuiWindow_*> *this;
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiViewportP *pIVar3;
  ImGuiContext *ctx;
  ImGuiWindow **ppIVar4;
  int n;
  int iVar5;
  long lVar6;
  
  ctx = GImGui;
  if (window->DockNode != node) {
    __assert_fail("window->DockNode == node",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3156,
                  "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
  }
  if ((save_dock_id != 0) && (node->ID != save_dock_id)) {
    __assert_fail("save_dock_id == 0 || save_dock_id == node->ID",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3159,
                  "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
  }
  window->DockNode = (ImGuiDockNode *)0x0;
  window->field_0x492 = window->field_0x492 & 0xfa;
  window->DockId = save_dock_id;
  lVar6 = 0;
  UpdateWindowParentAndRootLinks(window,window->Flags & 0xfeffffff,(ImGuiWindow *)0x0);
  this = &node->Windows;
  iVar5 = 0;
  while( true ) {
    if (this->Size <= iVar5) {
      __assert_fail("erased",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x316a,
                    "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
    }
    ppIVar4 = ImVector<ImGuiWindow_*>::operator[](this,iVar5);
    if (*ppIVar4 == window) break;
    iVar5 = iVar5 + 1;
    lVar6 = lVar6 + 8;
  }
  ImVector<ImGuiWindow_*>::erase(this,(ImGuiWindow **)(lVar6 + (long)(node->Windows).Data));
  if (node->VisibleWindow == window) {
    node->VisibleWindow = (ImGuiWindow *)0x0;
  }
  node->field_0xba = node->field_0xba | 2;
  if (node->TabBar == (ImGuiTabBar *)0x0) {
LAB_00134c5e:
    iVar5 = this->Size;
    if (iVar5 == 0) {
      if (((node->LocalFlags & 0xc00) == 0) && (window->DockId != node->ID)) {
        DockContextRemoveNode(ctx,node,true);
        return;
      }
      goto LAB_00134cdb;
    }
  }
  else {
    TabBarRemoveTab(node->TabBar,window->ID);
    iVar5 = (node->Windows).Size;
    if (iVar5 < (int)(((node->LocalFlags & 0x800) == 0) + 1)) {
      DockNodeRemoveTabBar(node);
      goto LAB_00134c5e;
    }
  }
  if (((iVar5 == 1) && ((node->LocalFlags & 0x800) == 0)) &&
     (node->HostWindow != (ImGuiWindow *)0x0)) {
    ppIVar4 = ImVector<ImGuiWindow_*>::operator[](this,0);
    pIVar1 = *ppIVar4;
    pIVar2 = node->HostWindow;
    if ((pIVar2->ViewportOwned == true) && (node->ParentNode == (ImGuiDockNode *)0x0)) {
      pIVar3 = pIVar2->Viewport;
      if (pIVar3->Window != pIVar2) {
        __assert_fail("node->HostWindow->Viewport->Window == node->HostWindow",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x3185,
                      "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
      }
      pIVar3->Window = pIVar1;
      (pIVar3->super_ImGuiViewport).ID = pIVar1->ID;
    }
    pIVar1->Collapsed = pIVar2->Collapsed;
  }
LAB_00134cdb:
  DockNodeUpdateVisibleFlag(node);
  return;
}

Assistant:

static void ImGui::DockNodeRemoveWindow(ImGuiDockNode* node, ImGuiWindow* window, ImGuiID save_dock_id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window->DockNode == node);
    //IM_ASSERT(window->RootWindow == node->HostWindow);
    //IM_ASSERT(window->LastFrameActive < g.FrameCount);    // We may call this from Begin()
    IM_ASSERT(save_dock_id == 0 || save_dock_id == node->ID);
    IMGUI_DEBUG_LOG_DOCKING("DockNodeRemoveWindow node 0x%08X window '%s'\n", node->ID, window->Name);

    window->DockNode = NULL;
    window->DockIsActive = window->DockTabWantClose = false;
    window->DockId = save_dock_id;
    UpdateWindowParentAndRootLinks(window, window->Flags & ~ImGuiWindowFlags_ChildWindow, NULL); // Update immediately

    // Remove window
    bool erased = false;
    for (int n = 0; n < node->Windows.Size; n++)
        if (node->Windows[n] == window)
        {
            node->Windows.erase(node->Windows.Data + n);
            erased = true;
            break;
        }
    IM_ASSERT(erased);
    if (node->VisibleWindow == window)
        node->VisibleWindow = NULL;

    // Remove tab and possibly tab bar
    node->WantHiddenTabBarUpdate = true;
    if (node->TabBar)
    {
        TabBarRemoveTab(node->TabBar, window->ID);
        const int tab_count_threshold_for_tab_bar = node->IsCentralNode() ? 1 : 2;
        if (node->Windows.Size < tab_count_threshold_for_tab_bar)
            DockNodeRemoveTabBar(node);
    }

    if (node->Windows.Size == 0 && !node->IsCentralNode() && !node->IsDockSpace() && window->DockId != node->ID)
    {
        // Automatic dock node delete themselves if they are not holding at least one tab
        DockContextRemoveNode(&g, node, true);
        return;
    }

    if (node->Windows.Size == 1 && !node->IsCentralNode() && node->HostWindow)
    {
        ImGuiWindow* remaining_window = node->Windows[0];
        if (node->HostWindow->ViewportOwned && node->IsRootNode())
        {
            // Transfer viewport back to the remaining loose window
            IM_ASSERT(node->HostWindow->Viewport->Window == node->HostWindow);
            node->HostWindow->Viewport->Window = remaining_window;
            node->HostWindow->Viewport->ID = remaining_window->ID;
        }
        remaining_window->Collapsed = node->HostWindow->Collapsed;
    }

    // Update visibility immediately is required so the DockNodeUpdateRemoveInactiveChilds() processing can reflect changes up the tree
    DockNodeUpdateVisibleFlag(node);
}